

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

int EvpathWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  EvpathCompletionHandle in_RSI;
  CP_Services in_RDI;
  int Ret;
  EvpathCompletionHandle Handle;
  int local_1c;
  
  local_1c = 1;
  if (in_RSI->CMcondition != -1) {
    (*in_RDI->verbose)(in_RSI->CPStream,5,
                       "Waiting for completion of memory read to rank %d, condition %d\n",
                       (ulong)(uint)in_RSI->Rank,(ulong)(uint)in_RSI->CMcondition);
  }
  if (in_RSI->CMcondition != -1) {
    CMCondition_wait(in_RSI->cm,in_RSI->CMcondition);
  }
  if (in_RSI->Failed == 0) {
    if (in_RSI->CMcondition != -1) {
      (*in_RDI->verbose)(in_RSI->CPStream,5,
                         "Remote memory read to rank %d with condition %d has completed\n",
                         (ulong)(uint)in_RSI->Rank,(ulong)(uint)in_RSI->CMcondition);
    }
  }
  else {
    (*in_RDI->verbose)(in_RSI->CPStream,5,
                       "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n"
                       ,(ulong)(uint)in_RSI->Rank,(ulong)(uint)in_RSI->CMcondition);
    local_1c = 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)in_RSI->DPStream + 0x18));
  RemoveRequestFromList(in_RDI,(Evpath_RS_Stream)in_RSI->DPStream,in_RSI);
  pthread_mutex_unlock((pthread_mutex_t *)((long)in_RSI->DPStream + 0x18));
  free(in_RSI);
  return local_1c;
}

Assistant:

static int EvpathWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    EvpathCompletionHandle Handle = (EvpathCompletionHandle)Handle_v;
    int Ret = 1;
    if (Handle->CMcondition != -1)
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Waiting for completion of memory read to rank %d, condition %d\n",
                      Handle->Rank, Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    if (Handle->CMcondition != -1)
        CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (Handle->Failed)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
        Ret = 0;
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    pthread_mutex_lock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    RemoveRequestFromList(Svcs, Handle->DPStream, Handle);
    pthread_mutex_unlock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    free(Handle);
    return Ret;
}